

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O2

bool __thiscall cmCTestCVS::UpdateImpl(cmCTestCVS *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *command;
  pointer pbVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> cvs_update;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string opts;
  UpdateParser out;
  UpdateParser err;
  string local_928;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_908;
  string local_8f0;
  UpdateParser local_8d0;
  UpdateParser local_478;
  
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::string::string((string *)&local_8d0,"UpdateOptions",(allocator *)&local_478);
  cmCTest::GetCTestConfiguration(&local_8f0,pcVar1,(string *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_8d0);
  command = extraout_RDX;
  if (local_8f0._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestVC).CTest;
    std::__cxx11::string::string((string *)&local_478,"CVSUpdateOptions",(allocator *)&local_928);
    cmCTest::GetCTestConfiguration((string *)&local_8d0,pcVar1,(string *)&local_478);
    std::__cxx11::string::operator=((string *)&local_8f0,(string *)&local_8d0);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::__cxx11::string::~string((string *)&local_478);
    command = extraout_RDX_00;
    if (local_8f0._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&local_8f0);
      command = extraout_RDX_01;
    }
  }
  cmSystemTools::ParseArguments_abi_cxx11_
            (&local_908,(cmSystemTools *)local_8f0._M_dataplus._M_p,command);
  if (((this->super_cmCTestVC).CTest)->TestModel == 1) {
    cmCTestVC::GetNightlyTime_abi_cxx11_(&local_928,&this->super_cmCTestVC);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_478,
                   "-D",&local_928);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_478,
                   " UTC");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_908,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8d0);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_928);
  }
  local_928.field_2._M_allocated_capacity = 0;
  local_928._M_dataplus._M_p = (pointer)0x0;
  local_928._M_string_length = 0;
  local_8d0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)(this->super_cmCTestVC).CommandLineTool._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_928,(char **)&local_8d0);
  local_8d0.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x5240de;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_928,(char **)&local_8d0);
  local_8d0.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x51c0bf;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_928,(char **)&local_8d0);
  for (pbVar3 = local_908.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != local_908.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    local_8d0.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)(pbVar3->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_928,(char **)&local_8d0);
  }
  local_8d0.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_928,(char **)&local_8d0);
  UpdateParser::UpdateParser(&local_8d0,this,"up-out> ");
  UpdateParser::UpdateParser(&local_478,this,"up-err> ");
  bVar2 = cmCTestVC::RunUpdateCommand
                    (&this->super_cmCTestVC,(char **)local_928._M_dataplus._M_p,
                     (OutputParser *)&local_8d0,(OutputParser *)&local_478);
  UpdateParser::~UpdateParser(&local_478);
  UpdateParser::~UpdateParser(&local_8d0);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&local_928);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_908);
  std::__cxx11::string::~string((string *)&local_8f0);
  return bVar2;
}

Assistant:

bool cmCTestCVS::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if(opts.empty())
    {
    opts = this->CTest->GetCTestConfiguration("CVSUpdateOptions");
    if(opts.empty())
      {
      opts = "-dP";
      }
    }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts.c_str());

  // Specify the start time for nightly testing.
  if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)
    {
    args.push_back("-D" + this->GetNightlyTime() + " UTC");
    }

  // Run "cvs update" to update the work tree.
  std::vector<char const*> cvs_update;
  cvs_update.push_back(this->CommandLineTool.c_str());
  cvs_update.push_back("-z3");
  cvs_update.push_back("update");
  for(std::vector<std::string>::const_iterator ai = args.begin();
      ai != args.end(); ++ai)
    {
    cvs_update.push_back(ai->c_str());
    }
  cvs_update.push_back(0);

  UpdateParser out(this, "up-out> ");
  UpdateParser err(this, "up-err> ");
  return this->RunUpdateCommand(&cvs_update[0], &out, &err);
}